

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O3

void __thiscall LinkedList::deletion(LinkedList *this,Node **head,int number)

{
  Node *pNVar1;
  Node **ppNVar2;
  Node *pNVar3;
  
  pNVar3 = *head;
  if (pNVar3 == (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Empty Linked List",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    return;
  }
  pNVar1 = pNVar3->next;
  if (pNVar1 == (Node *)0x0) {
    operator_delete(pNVar3,0x10);
    *head = (Node *)0x0;
  }
  else {
    if (pNVar3->data == number) {
      *head = pNVar1;
      operator_delete(pNVar3,0x10);
      return;
    }
    do {
      ppNVar2 = &pNVar3->next;
      pNVar3 = pNVar1;
      while (pNVar1 = pNVar3->next, pNVar3->data == number) {
        *ppNVar2 = pNVar1;
        operator_delete(pNVar3,0x10);
        pNVar3 = *ppNVar2;
        if (pNVar3 == (Node *)0x0) {
          return;
        }
      }
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

void LinkedList::deletion(Node** head, int number) {
	Node* last = *head;
	Node* next = nullptr;

	// Check if any node exists in linked list
	if (last == NULL) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	// Check if only one node is in linked list
	if (last->next == nullptr) {
		freeUpMemory(head);
		return;
	}

	// Check if node to delete is first node
	if (last->data == number) {
		*head = last->next;
		freeUpMemory(&last);
		return;
	}

	// Loop through and find node to delete
	while (last->next != nullptr) {
		next = last->next;
		if (next->data == number) {
			if (next->next == nullptr) {
				last->next = nullptr;
			} else {
				last->next = next->next;
			}
			freeUpMemory(&next);
		}
		else {
			last = last->next;
			continue;
		}
	}
}